

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O0

void __thiscall
Diligent::TextureBaseGL::CreateViewInternal
          (TextureBaseGL *this,TextureViewDesc *OrigViewDesc,ITextureView **ppView,
          bool bIsDefaultView)

{
  PFNGLTEXTUREVIEWPROC p_Var1;
  TEXTURE_FORMAT TVar2;
  bool bVar3;
  TEXTURE_FORMAT TVar4;
  Uint32 UVar5;
  Uint32 UVar6;
  GLuint GVar7;
  GLuint GVar8;
  GLint GVar9;
  Char *pCVar10;
  GLTextureObj *pGVar11;
  DeviceContextGLImpl *this_00;
  GLContextState *this_01;
  uint *puVar12;
  TextureBaseGL *local_548;
  TextureBaseGL *local_510;
  TextureBaseGL *local_4f0;
  RenderDeviceGLImpl *local_438;
  TextureBaseGL *local_410;
  bool local_3e5;
  char *ViewTypeName;
  runtime_error *anon_var_0;
  TextureBaseGL *local_390;
  MakeNewRCObj<Diligent::TextureViewGLImpl,_Diligent::FixedBlockMemoryAllocator> local_388;
  undefined1 local_360 [8];
  string msg_13;
  TextureBaseGL *local_338;
  MakeNewRCObj<Diligent::TextureViewGLImpl,_Diligent::FixedBlockMemoryAllocator> local_330;
  undefined1 local_308 [8];
  string msg_12;
  TextureBaseGL *local_2e0;
  MakeNewRCObj<Diligent::TextureViewGLImpl,_Diligent::FixedBlockMemoryAllocator> local_2d8;
  undefined1 local_2b0 [8];
  string msg_11;
  string msg_10;
  uint local_268;
  GLTextureObj local_264;
  undefined1 local_258 [8];
  string msg_9;
  undefined1 local_230 [4];
  GLenum err_4;
  string msg_8;
  undefined1 local_208 [4];
  GLenum err_3;
  string msg_7;
  undefined1 local_1e0 [4];
  GLenum err_2;
  string msg_6;
  GLenum err_1;
  GLContextState *GLState;
  string msg_5;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pDeviceContext;
  undefined1 local_180 [4];
  GLenum err;
  string msg_4;
  uint local_158;
  uint local_154;
  uint local_150;
  GLuint local_14c;
  Uint32 MipDepth;
  GLuint NumLayers;
  GLenum GLViewTarget;
  MakeNewRCObj<Diligent::TextureViewGLImpl,_Diligent::FixedBlockMemoryAllocator> local_138;
  bool local_109;
  TextureViewGLImpl *pTStack_108;
  bool bIsFullTextureView;
  TextureViewGLImpl *pViewOGL;
  string msg_3;
  undefined1 local_d8 [4];
  GLenum GLViewFormat;
  string msg_2;
  FixedBlockMemoryAllocator *TexViewAllocator;
  RenderDeviceGLImpl *pDeviceGLImpl;
  TextureViewDesc ViewDesc;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  bool bIsDefaultView_local;
  ITextureView **ppView_local;
  TextureViewDesc *OrigViewDesc_local;
  TextureBaseGL *this_local;
  
  msg.field_2._M_local_buf[0xf] = bIsDefaultView;
  if (ppView == (ITextureView **)0x0) {
    FormatString<char[22]>((string *)local_50,(char (*) [22])"Null pointer provided");
    pCVar10 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar10,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x18c);
    std::__cxx11::string::~string((string *)local_50);
    return;
  }
  if (*ppView != (ITextureView *)0x0) {
    FormatString<char[64]>
              ((string *)&ViewDesc.Swizzle.B,
               (char (*) [64])"Overwriting reference to existing object may cause memory leaks");
    pCVar10 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar10,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x18e);
    std::__cxx11::string::~string((string *)&ViewDesc.Swizzle.B);
  }
  *ppView = (ITextureView *)0x0;
  ViewDesc._24_8_ = *(undefined8 *)&(OrigViewDesc->Swizzle).B;
  pDeviceGLImpl = (RenderDeviceGLImpl *)(OrigViewDesc->super_DeviceObjectAttribs).Name;
  ViewDesc.super_DeviceObjectAttribs.Name = *(Char **)&OrigViewDesc->ViewType;
  ViewDesc._8_8_ = *(undefined8 *)&OrigViewDesc->NumMipLevels;
  ViewDesc._16_8_ = *(undefined8 *)&OrigViewDesc->field_6;
  ValidatedAndCorrectTextureViewDesc
            (&(this->super_TextureBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
              .m_Desc,(TextureViewDesc *)&pDeviceGLImpl);
  TexViewAllocator =
       (FixedBlockMemoryAllocator *)
       DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>::
       GetDevice((DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                  *)this);
  msg_2.field_2._8_8_ =
       RenderDeviceBase<Diligent::EngineGLImplTraits>::GetTexViewObjAllocator
                 ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)TexViewAllocator);
  if ((FixedBlockMemoryAllocator *)msg_2.field_2._8_8_ !=
      (this->super_TextureBase<Diligent::EngineGLImplTraits>).m_dbgTexViewObjAllocator) {
    FormatString<char[87]>
              ((string *)local_d8,
               (char (*) [87])
               "Texture view allocator does not match allocator provided during texture initialization"
              );
    pCVar10 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar10,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x199);
    std::__cxx11::string::~string((string *)local_d8);
  }
  msg_3.field_2._12_4_ =
       TexFormatToGLInternalTexFormat
                 (ViewDesc.super_DeviceObjectAttribs.Name._2_2_,
                  (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                  .m_Desc.BindFlags);
  if (msg_3.field_2._12_4_ == 0) {
    FormatString<char[27]>((string *)&pViewOGL,(char (*) [27])"Unsupported texture format");
    pCVar10 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar10,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x19e);
    std::__cxx11::string::~string((string *)&pViewOGL);
  }
  pTStack_108 = (TextureViewGLImpl *)0x0;
  if ((char)ViewDesc.super_DeviceObjectAttribs.Name == '\x01') {
    local_3e5 = false;
    if (ViewDesc.super_DeviceObjectAttribs.Name._1_1_ ==
        (this->super_TextureBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
        .m_Desc.Type) {
      TVar2 = ViewDesc.super_DeviceObjectAttribs.Name._2_2_;
      TVar4 = GetDefaultTextureViewFormat
                        ((this->super_TextureBase<Diligent::EngineGLImplTraits>).
                         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         .m_Desc.Format,TEXTURE_VIEW_SHADER_RESOURCE,
                         (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         .m_Desc.BindFlags);
      local_3e5 = false;
      if (TVar2 == TVar4) {
        local_3e5 = false;
        if (ViewDesc.super_DeviceObjectAttribs.Name._4_4_ == 0) {
          local_3e5 = false;
          if (ViewDesc._8_4_ ==
              (this->super_TextureBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
              .m_Desc.MipLevels) {
            UVar5 = TextureViewDesc::FirstArrayOrDepthSlice((TextureViewDesc *)&pDeviceGLImpl);
            local_3e5 = false;
            if (UVar5 == 0) {
              UVar5 = TextureViewDesc::NumArrayOrDepthSlices((TextureViewDesc *)&pDeviceGLImpl);
              UVar6 = TextureDesc::ArraySizeOrDepth
                                (&(this->super_TextureBase<Diligent::EngineGLImplTraits>).
                                  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                  .m_Desc);
              local_3e5 = false;
              if (UVar5 == UVar6) {
                local_3e5 = IsIdentityComponentMapping
                                      ((TextureComponentMapping *)((long)&ViewDesc.field_5 + 2));
              }
            }
          }
        }
      }
    }
    local_109 = local_3e5;
    local_410 = this;
    if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
      local_410 = (TextureBaseGL *)0x0;
    }
    MakeNewRCObj<Diligent::TextureViewGLImpl,_Diligent::FixedBlockMemoryAllocator>::MakeNewRCObj
              (&local_138,(FixedBlockMemoryAllocator *)msg_2.field_2._8_8_,
               "TextureViewGLImpl instance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x1ae,(IObject *)local_410);
    NumLayers._3_1_ = ~local_109 & 1;
    _GLViewTarget = this;
    pTStack_108 = MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>::
                  operator()((MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>
                              *)&local_138,(RenderDeviceGLImpl **)&TexViewAllocator,
                             (TextureViewDesc *)&pDeviceGLImpl,(TextureBaseGL **)&GLViewTarget,
                             (bool *)((long)&NumLayers + 3),(bool *)(msg.field_2._M_local_buf + 0xf)
                            );
    if ((local_109 & 1U) == 0) {
      MipDepth = 0;
      local_14c = ViewDesc.NumMipLevels;
      switch(ViewDesc.super_DeviceObjectAttribs.Name._1_1_) {
      case RESOURCE_DIM_TEX_1D:
        MipDepth = 0xde0;
        local_14c = 1;
        ViewDesc.NumMipLevels = 1;
        break;
      case RESOURCE_DIM_TEX_1D_ARRAY:
        MipDepth = 0x8c18;
        break;
      case RESOURCE_DIM_TEX_2D:
        MipDepth = 0xde1;
        if (1 < (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                .m_Desc.SampleCount) {
          MipDepth = 0x9100;
        }
        local_14c = 1;
        ViewDesc.NumMipLevels = 1;
        break;
      case RESOURCE_DIM_TEX_2D_ARRAY:
        MipDepth = 0x8c1a;
        if (1 < (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                .m_Desc.SampleCount) {
          MipDepth = 0x9102;
        }
        break;
      case RESOURCE_DIM_TEX_3D:
        MipDepth = 0x806f;
        local_154 = (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                    super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                    .m_Desc.field_3.ArraySize >>
                    (ViewDesc.super_DeviceObjectAttribs.Name._4_1_ & 0x1f);
        local_158 = 1;
        puVar12 = std::max<unsigned_int>(&local_154,&local_158);
        local_150 = *puVar12;
        if ((ViewDesc.MostDetailedMip != 0) || (ViewDesc.NumMipLevels != local_150)) {
          if (pDeviceGLImpl == (RenderDeviceGLImpl *)0x0) {
            local_438 = (RenderDeviceGLImpl *)0x46c893;
          }
          else {
            local_438 = pDeviceGLImpl;
          }
          msg_4.field_2._8_8_ = local_438;
          LogError<false,char[18],char_const*,char[23],unsigned_int,char[15],unsigned_int,char[16],unsigned_int,char[21],unsigned_int,char[15],char_const*,char[98]>
                    (false,"CreateViewInternal",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0x1d5,(char (*) [18])"3D texture view \'",(char **)((long)&msg_4.field_2 + 8),
                     (char (*) [23])"\' (most detailed mip: ",
                     (uint *)((long)&ViewDesc.super_DeviceObjectAttribs.Name + 4),
                     (char (*) [15])"; mip levels: ",(uint *)&ViewDesc.ViewType,
                     (char (*) [16])"; first slice: ",&ViewDesc.MostDetailedMip,
                     (char (*) [21])"; num depth slices: ",&ViewDesc.NumMipLevels,
                     (char (*) [15])") of texture \'",
                     (char **)&(this->super_TextureBase<Diligent::EngineGLImplTraits>).
                               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                               .m_Desc,
                     (char (*) [98])
                     "\' does not references all depth slices. 3D texture views in OpenGL must address all depth slices."
                    );
          ViewDesc.NumMipLevels = local_150;
          ViewDesc._8_8_ = ViewDesc._8_8_ & 0xffffffff;
        }
        local_14c = 1;
        break;
      case RESOURCE_DIM_TEX_CUBE:
        MipDepth = 0x8513;
        break;
      case RESOURCE_DIM_TEX_CUBE_ARRAY:
        MipDepth = 0x9009;
        break;
      default:
        FormatString<char[30]>((string *)local_180,(char (*) [30])"Unsupported texture view type");
        pCVar10 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar10,"CreateViewInternal",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                   ,0x1e5);
        std::__cxx11::string::~string((string *)local_180);
      }
      if (__glewTextureView == (PFNGLTEXTUREVIEWPROC)0x0) {
        LogError<true,char[31]>
                  (false,"CreateViewInternal",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                   ,0x1ea,(char (*) [31])"glTextureView is not supported");
      }
      p_Var1 = __glewTextureView;
      pGVar11 = TextureViewGLImpl::GetHandle(pTStack_108);
      GVar7 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)pGVar11)
      ;
      UVar5 = MipDepth;
      GVar8 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                        ((GLObjWrapper *)&this->m_GlTexture);
      (*p_Var1)(GVar7,UVar5,GVar8,msg_3.field_2._12_4_,ViewDesc.super_DeviceObjectAttribs.Name._4_4_
                ,ViewDesc._8_4_,ViewDesc.MostDetailedMip,local_14c);
      pDeviceContext.m_pObject._4_4_ = glGetError();
      if (pDeviceContext.m_pObject._4_4_ != 0) {
        LogError<true,char[30],char[17],unsigned_int>
                  (false,"CreateViewInternal",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                   ,0x1ed,(char (*) [30])"Failed to create texture view",
                   (char (*) [17])"\nGL Error Code: ",(uint *)((long)&pDeviceContext.m_pObject + 4))
        ;
      }
      TextureViewGLImpl::SetBindTarget(pTStack_108,MipDepth);
      bVar3 = IsIdentityComponentMapping((TextureComponentMapping *)((long)&ViewDesc.field_5 + 2));
      if (!bVar3) {
        RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
                  ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)((long)&msg_5.field_2 + 8),
                   (size_t)TexViewAllocator);
        bVar3 = RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator!
                          ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)
                           ((long)&msg_5.field_2 + 8));
        if (bVar3) {
          FormatString<char[44]>
                    ((string *)&GLState,(char (*) [44])"Immediate device context has been destroyed"
                    );
          pCVar10 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar10,"CreateViewInternal",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,499);
          std::__cxx11::string::~string((string *)&GLState);
        }
        this_00 = RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator->
                            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)
                             ((long)&msg_5.field_2 + 8));
        this_01 = DeviceContextGLImpl::GetContextState(this_00);
        UVar5 = MipDepth;
        pGVar11 = TextureViewGLImpl::GetHandle(pTStack_108);
        GLContextState::BindTexture(this_01,-1,UVar5,pGVar11);
        UVar5 = MipDepth;
        GVar9 = TextureComponentSwizzleToGLTextureSwizzle
                          (ViewDesc.field_5.FirstArraySlice._2_1_,0x1903);
        glTexParameteri(UVar5,0x8e42,GVar9);
        msg_6.field_2._12_4_ = glGetError();
        if (msg_6.field_2._12_4_ != 0) {
          LogError<false,char[53],char[17],unsigned_int>
                    (false,"CreateViewInternal",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0x1f8,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_R texture parameter",
                     (char (*) [17])"\nGL Error Code: ",(uint *)(msg_6.field_2._M_local_buf + 0xc));
          FormatString<char[6]>((string *)local_1e0,(char (*) [6])0x4585f6);
          pCVar10 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar10,"CreateViewInternal",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0x1f8);
          std::__cxx11::string::~string((string *)local_1e0);
        }
        UVar5 = MipDepth;
        GVar9 = TextureComponentSwizzleToGLTextureSwizzle
                          (ViewDesc.field_5.FirstArraySlice._3_1_,0x1904);
        glTexParameteri(UVar5,0x8e43,GVar9);
        msg_7.field_2._12_4_ = glGetError();
        if (msg_7.field_2._12_4_ != 0) {
          LogError<false,char[53],char[17],unsigned_int>
                    (false,"CreateViewInternal",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0x1fa,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_G texture parameter",
                     (char (*) [17])"\nGL Error Code: ",(uint *)(msg_7.field_2._M_local_buf + 0xc));
          FormatString<char[6]>((string *)local_208,(char (*) [6])0x4585f6);
          pCVar10 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar10,"CreateViewInternal",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0x1fa);
          std::__cxx11::string::~string((string *)local_208);
        }
        UVar5 = MipDepth;
        GVar9 = TextureComponentSwizzleToGLTextureSwizzle
                          (ViewDesc.field_6.NumArraySlices._0_1_,0x1905);
        glTexParameteri(UVar5,0x8e44,GVar9);
        msg_8.field_2._12_4_ = glGetError();
        if (msg_8.field_2._12_4_ != 0) {
          LogError<false,char[53],char[17],unsigned_int>
                    (false,"CreateViewInternal",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0x1fc,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_B texture parameter",
                     (char (*) [17])"\nGL Error Code: ",(uint *)(msg_8.field_2._M_local_buf + 0xc));
          FormatString<char[6]>((string *)local_230,(char (*) [6])0x4585f6);
          pCVar10 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar10,"CreateViewInternal",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0x1fc);
          std::__cxx11::string::~string((string *)local_230);
        }
        UVar5 = MipDepth;
        GVar9 = TextureComponentSwizzleToGLTextureSwizzle
                          (ViewDesc.field_6.NumArraySlices._1_1_,0x1906);
        glTexParameteri(UVar5,0x8e45,GVar9);
        msg_9.field_2._12_4_ = glGetError();
        if (msg_9.field_2._12_4_ != 0) {
          LogError<false,char[53],char[17],unsigned_int>
                    (false,"CreateViewInternal",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0x1fe,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_A texture parameter",
                     (char (*) [17])"\nGL Error Code: ",(uint *)(msg_9.field_2._M_local_buf + 0xc));
          FormatString<char[6]>((string *)local_258,(char (*) [6])0x4585f6);
          pCVar10 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar10,"CreateViewInternal",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0x1fe);
          std::__cxx11::string::~string((string *)local_258);
        }
        UVar5 = MipDepth;
        GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::Null();
        GLContextState::BindTexture(this_01,-1,UVar5,&local_264);
        GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::
        ~GLObjWrapper(&local_264);
        RefCntAutoPtr<Diligent::DeviceContextGLImpl>::~RefCntAutoPtr
                  ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg_5.field_2 + 8));
      }
    }
    goto LAB_00260f23;
  }
  if ((char)ViewDesc.super_DeviceObjectAttribs.Name != '\x05') {
    if ((char)ViewDesc.super_DeviceObjectAttribs.Name == '\x02') {
      if (ViewDesc._8_4_ != 1) {
        FormatString<char[44]>
                  ((string *)local_308,(char (*) [44])"Only a single mip level can be bound as RTV")
        ;
        pCVar10 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar10,"CreateViewInternal",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                   ,0x213);
        std::__cxx11::string::~string((string *)local_308);
      }
      local_510 = this;
      if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
        local_510 = (TextureBaseGL *)0x0;
      }
      MakeNewRCObj<Diligent::TextureViewGLImpl,_Diligent::FixedBlockMemoryAllocator>::MakeNewRCObj
                (&local_330,(FixedBlockMemoryAllocator *)msg_2.field_2._8_8_,
                 "TextureViewGLImpl instance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x214,(IObject *)local_510);
      msg_13.field_2._M_local_buf[0xf] = '\0';
      local_338 = this;
      pTStack_108 = MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>::
                    operator()((MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>
                                *)&local_330,(RenderDeviceGLImpl **)&TexViewAllocator,
                               (TextureViewDesc *)&pDeviceGLImpl,&local_338,
                               (bool *)(msg_13.field_2._M_local_buf + 0xf),
                               (bool *)(msg.field_2._M_local_buf + 0xf));
    }
    else if (((char)ViewDesc.super_DeviceObjectAttribs.Name == '\x03') ||
            ((char)ViewDesc.super_DeviceObjectAttribs.Name == '\x04')) {
      if (ViewDesc._8_4_ != 1) {
        FormatString<char[44]>
                  ((string *)local_360,(char (*) [44])"Only a single mip level can be bound as DSV")
        ;
        pCVar10 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar10,"CreateViewInternal",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                   ,0x21b);
        std::__cxx11::string::~string((string *)local_360);
      }
      local_548 = this;
      if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
        local_548 = (TextureBaseGL *)0x0;
      }
      MakeNewRCObj<Diligent::TextureViewGLImpl,_Diligent::FixedBlockMemoryAllocator>::MakeNewRCObj
                (&local_388,(FixedBlockMemoryAllocator *)msg_2.field_2._8_8_,
                 "TextureViewGLImpl instance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x21c,(IObject *)local_548);
      anon_var_0._7_1_ = 0;
      local_390 = this;
      pTStack_108 = MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>::
                    operator()((MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>
                                *)&local_388,(RenderDeviceGLImpl **)&TexViewAllocator,
                               (TextureViewDesc *)&pDeviceGLImpl,&local_390,
                               (bool *)((long)&anon_var_0 + 7),
                               (bool *)(msg.field_2._M_local_buf + 0xf));
    }
    goto LAB_00260f23;
  }
  UVar5 = TextureViewDesc::NumArrayOrDepthSlices((TextureViewDesc *)&pDeviceGLImpl);
  bVar3 = true;
  if (UVar5 != 1) {
    if ((this->super_TextureBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
        .m_Desc.Type == RESOURCE_DIM_TEX_3D) {
      UVar5 = ViewDesc.NumMipLevels;
      local_268 = (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                  .m_Desc.field_3.ArraySize >>
                  (ViewDesc.super_DeviceObjectAttribs.Name._4_1_ & 0x1f);
      msg_10.field_2._12_4_ = 1;
      puVar12 = std::max<unsigned_int>(&local_268,(uint *)(msg_10.field_2._M_local_buf + 0xc));
      bVar3 = true;
      if (UVar5 == *puVar12) goto LAB_00260989;
    }
    bVar3 = ViewDesc.NumMipLevels ==
            (this->super_TextureBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            .m_Desc.field_3.ArraySize;
  }
LAB_00260989:
  if (!bVar3) {
    FormatString<char[82]>
              ((string *)((long)&msg_11.field_2 + 8),
               (char (*) [82])
               "Only single array/depth slice or the whole texture can be bound as UAV in OpenGL.");
    pCVar10 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar10,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x209);
    std::__cxx11::string::~string((string *)(msg_11.field_2._M_local_buf + 8));
  }
  if (ViewDesc.field_5.FirstArraySlice._0_1_ == '\0') {
    FormatString<char[43]>
              ((string *)local_2b0,(char (*) [43])"At least one access flag must be specified");
    pCVar10 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar10,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x20b);
    std::__cxx11::string::~string((string *)local_2b0);
  }
  local_4f0 = this;
  if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_4f0 = (TextureBaseGL *)0x0;
  }
  MakeNewRCObj<Diligent::TextureViewGLImpl,_Diligent::FixedBlockMemoryAllocator>::MakeNewRCObj
            (&local_2d8,(FixedBlockMemoryAllocator *)msg_2.field_2._8_8_,
             "TextureViewGLImpl instance",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
             ,0x20c,(IObject *)local_4f0);
  msg_12.field_2._M_local_buf[0xf] = '\0';
  local_2e0 = this;
  pTStack_108 = MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>::
                operator()((MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>
                            *)&local_2d8,(RenderDeviceGLImpl **)&TexViewAllocator,
                           (TextureViewDesc *)&pDeviceGLImpl,&local_2e0,
                           (bool *)(msg_12.field_2._M_local_buf + 0xf),
                           (bool *)(msg.field_2._M_local_buf + 0xf));
LAB_00260f23:
  if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
    if (pTStack_108 != (TextureViewGLImpl *)0x0) {
      TextureViewGLImpl::QueryInterface
                (pTStack_108,(INTERFACE_ID *)IID_TextureView,(IObject **)ppView);
    }
  }
  else {
    *ppView = (ITextureView *)pTStack_108;
  }
  return;
}

Assistant:

void TextureBaseGL::CreateViewInternal(const TextureViewDesc& OrigViewDesc, ITextureView** ppView, bool bIsDefaultView)
{
    VERIFY(ppView != nullptr, "Null pointer provided");
    if (!ppView) return;
    VERIFY(*ppView == nullptr, "Overwriting reference to existing object may cause memory leaks");

    *ppView = nullptr;

    try
    {
        TextureViewDesc ViewDesc = OrigViewDesc;
        ValidatedAndCorrectTextureViewDesc(m_Desc, ViewDesc);

        RenderDeviceGLImpl*        pDeviceGLImpl    = GetDevice();
        FixedBlockMemoryAllocator& TexViewAllocator = pDeviceGLImpl->GetTexViewObjAllocator();
        VERIFY(&TexViewAllocator == &m_dbgTexViewObjAllocator, "Texture view allocator does not match allocator provided during texture initialization");

        // http://www.opengl.org/wiki/Texture_Storage#Texture_views

        GLenum GLViewFormat = TexFormatToGLInternalTexFormat(ViewDesc.Format, m_Desc.BindFlags);
        VERIFY(GLViewFormat != 0, "Unsupported texture format");

        TextureViewGLImpl* pViewOGL = nullptr;
        if (ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE)
        {
            // clang-format off
            bool bIsFullTextureView =
                ViewDesc.TextureDim               == m_Desc.Type &&
                ViewDesc.Format                   == GetDefaultTextureViewFormat(m_Desc.Format, ViewDesc.ViewType, m_Desc.BindFlags) &&
                ViewDesc.MostDetailedMip          == 0 &&
                ViewDesc.NumMipLevels             == m_Desc.MipLevels &&
                ViewDesc.FirstArrayOrDepthSlice() == 0 &&
                ViewDesc.NumArrayOrDepthSlices()  == m_Desc.ArraySizeOrDepth() &&
                IsIdentityComponentMapping(ViewDesc.Swizzle);
            // clang-format on

            pViewOGL = NEW_RC_OBJ(TexViewAllocator, "TextureViewGLImpl instance", TextureViewGLImpl, bIsDefaultView ? this : nullptr)(
                pDeviceGLImpl, ViewDesc, this,
                !bIsFullTextureView, // Create OpenGL texture view object if view
                                     // does not address the whole texture
                bIsDefaultView);
            if (!bIsFullTextureView)
            {
                GLenum GLViewTarget = 0;
                GLuint NumLayers    = ViewDesc.NumArraySlices;
                switch (ViewDesc.TextureDim)
                {
                    case RESOURCE_DIM_TEX_1D:
                        GLViewTarget            = GL_TEXTURE_1D;
                        ViewDesc.NumArraySlices = NumLayers = 1;
                        break;

                    case RESOURCE_DIM_TEX_1D_ARRAY:
                        GLViewTarget = GL_TEXTURE_1D_ARRAY;
                        break;

                    case RESOURCE_DIM_TEX_2D:
                        GLViewTarget            = m_Desc.SampleCount > 1 ? GL_TEXTURE_2D_MULTISAMPLE : GL_TEXTURE_2D;
                        ViewDesc.NumArraySlices = NumLayers = 1;
                        break;

                    case RESOURCE_DIM_TEX_2D_ARRAY:
                        GLViewTarget = m_Desc.SampleCount > 1 ? GL_TEXTURE_2D_MULTISAMPLE_ARRAY : GL_TEXTURE_2D_ARRAY;
                        break;

                    case RESOURCE_DIM_TEX_3D:
                    {
                        GLViewTarget = GL_TEXTURE_3D;
                        // If target is GL_TEXTURE_3D, NumLayers must equal 1.
                        Uint32 MipDepth = std::max(m_Desc.Depth >> ViewDesc.MostDetailedMip, 1U);
                        if (ViewDesc.FirstDepthSlice != 0 || ViewDesc.NumDepthSlices != MipDepth)
                        {
                            LOG_ERROR("3D texture view '", (ViewDesc.Name ? ViewDesc.Name : ""), "' (most detailed mip: ", ViewDesc.MostDetailedMip,
                                      "; mip levels: ", ViewDesc.NumMipLevels, "; first slice: ", ViewDesc.FirstDepthSlice,
                                      "; num depth slices: ", ViewDesc.NumDepthSlices, ") of texture '", m_Desc.Name, "' does not references"
                                                                                                                      " all depth slices. 3D texture views in OpenGL must address all depth slices.");
                            ViewDesc.NumDepthSlices  = MipDepth;
                            ViewDesc.FirstDepthSlice = 0;
                        }
                        NumLayers = 1;
                        break;
                    }

                    case RESOURCE_DIM_TEX_CUBE:
                        GLViewTarget = GL_TEXTURE_CUBE_MAP;
                        break;

                    case RESOURCE_DIM_TEX_CUBE_ARRAY:
                        GLViewTarget = GL_TEXTURE_CUBE_MAP_ARRAY;
                        break;

                    default: UNEXPECTED("Unsupported texture view type");
                }

                // In OpenGL ES this function is allowed as an extension and may not be supported
                if (glTextureView == nullptr)
                    LOG_ERROR_AND_THROW("glTextureView is not supported");

                glTextureView(pViewOGL->GetHandle(), GLViewTarget, m_GlTexture, GLViewFormat, ViewDesc.MostDetailedMip, ViewDesc.NumMipLevels, ViewDesc.FirstArraySlice, NumLayers);
                DEV_CHECK_GL_ERROR_AND_THROW("Failed to create texture view");
                pViewOGL->SetBindTarget(GLViewTarget);

                if (!IsIdentityComponentMapping(ViewDesc.Swizzle))
                {
                    RefCntAutoPtr<DeviceContextGLImpl> pDeviceContext = pDeviceGLImpl->GetImmediateContext(0);
                    VERIFY(pDeviceContext, "Immediate device context has been destroyed");
                    GLContextState& GLState = pDeviceContext->GetContextState();

                    GLState.BindTexture(-1, GLViewTarget, pViewOGL->GetHandle());
                    glTexParameteri(GLViewTarget, GL_TEXTURE_SWIZZLE_R, TextureComponentSwizzleToGLTextureSwizzle(ViewDesc.Swizzle.R, GL_RED));
                    DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_R texture parameter");
                    glTexParameteri(GLViewTarget, GL_TEXTURE_SWIZZLE_G, TextureComponentSwizzleToGLTextureSwizzle(ViewDesc.Swizzle.G, GL_GREEN));
                    DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_G texture parameter");
                    glTexParameteri(GLViewTarget, GL_TEXTURE_SWIZZLE_B, TextureComponentSwizzleToGLTextureSwizzle(ViewDesc.Swizzle.B, GL_BLUE));
                    DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_B texture parameter");
                    glTexParameteri(GLViewTarget, GL_TEXTURE_SWIZZLE_A, TextureComponentSwizzleToGLTextureSwizzle(ViewDesc.Swizzle.A, GL_ALPHA));
                    DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_A texture parameter");
                    GLState.BindTexture(-1, GLViewTarget, GLObjectWrappers::GLTextureObj::Null());
                }
            }
        }
        else if (ViewDesc.ViewType == TEXTURE_VIEW_UNORDERED_ACCESS)
        {
            // clang-format off
            VERIFY(ViewDesc.NumArrayOrDepthSlices() == 1 ||
                   (m_Desc.Type == RESOURCE_DIM_TEX_3D && ViewDesc.NumDepthSlices == std::max(m_Desc.Depth >> ViewDesc.MostDetailedMip, 1U)) ||
                   ViewDesc.NumArraySlices == m_Desc.ArraySize,
                   "Only single array/depth slice or the whole texture can be bound as UAV in OpenGL.");
            // clang-format on
            VERIFY(ViewDesc.AccessFlags != 0, "At least one access flag must be specified");
            pViewOGL = NEW_RC_OBJ(TexViewAllocator, "TextureViewGLImpl instance", TextureViewGLImpl, bIsDefaultView ? this : nullptr)(
                pDeviceGLImpl, ViewDesc, this,
                false, // Do NOT create texture view OpenGL object
                bIsDefaultView);
        }
        else if (ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET)
        {
            VERIFY(ViewDesc.NumMipLevels == 1, "Only a single mip level can be bound as RTV");
            pViewOGL = NEW_RC_OBJ(TexViewAllocator, "TextureViewGLImpl instance", TextureViewGLImpl, bIsDefaultView ? this : nullptr)(
                pDeviceGLImpl, ViewDesc, this,
                false, // Do NOT create texture view OpenGL object
                bIsDefaultView);
        }
        else if (ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL || ViewDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
        {
            VERIFY(ViewDesc.NumMipLevels == 1, "Only a single mip level can be bound as DSV");
            pViewOGL = NEW_RC_OBJ(TexViewAllocator, "TextureViewGLImpl instance", TextureViewGLImpl, bIsDefaultView ? this : nullptr)(
                pDeviceGLImpl, ViewDesc, this,
                false, // Do NOT create texture view OpenGL object
                bIsDefaultView);
        }

        if (bIsDefaultView)
            *ppView = pViewOGL;
        else
        {
            if (pViewOGL)
            {
                pViewOGL->QueryInterface(IID_TextureView, reinterpret_cast<IObject**>(ppView));
            }
        }
    }
    catch (const std::runtime_error&)
    {
        const char* ViewTypeName = GetTexViewTypeLiteralName(OrigViewDesc.ViewType);
        LOG_ERROR("Failed to create view '", (OrigViewDesc.Name ? OrigViewDesc.Name : ""), "' (", ViewTypeName, ") for texture '", (m_Desc.Name ? m_Desc.Name : ""), "'");
    }
}